

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O0

string * __thiscall
t_st_generator::type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_st_generator *this,t_type *ttype)

{
  byte bVar1;
  t_program *this_00;
  string *__lhs;
  string *psVar2;
  string local_e0;
  string local_c0;
  undefined1 local_a0 [8];
  string name;
  t_program *program;
  allocator local_41;
  undefined1 local_40 [8];
  string prefix;
  t_type *ttype_local;
  t_st_generator *this_local;
  
  prefix.field_2._8_8_ = ttype;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,"",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  this_00 = t_type::get_program((t_type *)prefix.field_2._8_8_);
  if (((this_00 != (t_program *)0x0) &&
      (this_00 != (this->super_t_oop_generator).super_t_generator.program_)) &&
     (bVar1 = (**(code **)(*(long *)prefix.field_2._8_8_ + 0x88))(), (bVar1 & 1) == 0)) {
    __lhs = t_program::get_name_abi_cxx11_(this_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&name.field_2 + 8),__lhs,"_types.");
    std::__cxx11::string::operator=((string *)local_40,(string *)(name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  }
  psVar2 = (string *)(**(code **)(*(long *)prefix.field_2._8_8_ + 0x18))();
  std::__cxx11::string::string((string *)local_a0,psVar2);
  bVar1 = (**(code **)(*(long *)prefix.field_2._8_8_ + 0x58))();
  if (((bVar1 & 1) != 0) ||
     (bVar1 = (**(code **)(*(long *)prefix.field_2._8_8_ + 0x60))(), (bVar1 & 1) != 0)) {
    psVar2 = (string *)(**(code **)(*(long *)prefix.field_2._8_8_ + 0x18))();
    std::__cxx11::string::string((string *)&local_e0,psVar2);
    t_generator::capitalize(&local_c0,(t_generator *)this,&local_e0);
    std::__cxx11::string::operator=((string *)local_a0,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::type_name(t_type* ttype) {
  string prefix = "";
  t_program* program = ttype->get_program();
  if (program != nullptr && program != program_) {
    if (!ttype->is_service()) {
      prefix = program->get_name() + "_types.";
    }
  }

  string name = ttype->get_name();
  if (ttype->is_struct() || ttype->is_xception()) {
    name = capitalize(ttype->get_name());
  }

  return prefix + name;
}